

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void MultiplicationHelper<short,_unsigned_long_long,_13>::
     MultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (short t,uint64_t *u,short *ret)

{
  undefined8 *in_RSI;
  int32_t tmp;
  int32_t *unaff_retaddr;
  uint64_t u1;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar1;
  int u_00;
  
  u_00 = (int)((ulong)*in_RSI >> 0x20);
  uVar1 = 0;
  LargeIntRegMultiply<int,_unsigned_long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (ret._4_4_,(uint64_t *)u1,unaff_retaddr);
  SafeCastHelper<short,_int,_4>::CastThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (u_00,(short *)CONCAT44(uVar1,in_stack_ffffffffffffffd8));
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void MultiplyThrow(T t, const std::uint64_t& u, T& ret) SAFEINT_CPP_THROW
    {
        static_assert(safeint_internal::int_traits<U>::isUint64, "U must be Uint64");
        std::uint64_t u1 = u;
        std::int32_t tmp = 0;

        LargeIntRegMultiply< std::int32_t, std::uint64_t >::template RegMultiplyThrow< E >( (std::int32_t)t, u1, &tmp );
        SafeCastHelper< T, std::int32_t, GetCastMethod< T, std::int32_t >::method >::template CastThrow< E >( tmp, ret );
    }